

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreducedspace.cpp
# Opt level: O0

int __thiscall TPZReducedSpace::NConnectShapeF(TPZReducedSpace *this,int inod,int order)

{
  uint uVar1;
  TPZConnect *this_00;
  long *in_RDI;
  TPZConnect *c;
  
  this_00 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,0);
  uVar1 = TPZConnect::NShape(this_00);
  return uVar1;
}

Assistant:

int TPZReducedSpace::NConnectShapeF(int inod, int order) const
{
#ifdef PZDEBUG
    if (inod != 0) {
        DebugStop();
    }
#endif
    TPZConnect &c = Connect(0);
    return c.NShape();
}